

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_s2c_sig_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uchar *s2c_data,
              size_t s2c_data_len,uint32_t flags,uchar *s2c_opening_out,size_t s2c_opening_out_len,
              uchar *bytes_out,size_t len)

{
  int iVar1;
  secp256k1_context *ctx_00;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_s2c_opening opening_secp;
  secp256k1_ecdsa_signature sig_secp;
  size_t s2c_data_len_local;
  uchar *s2c_data_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  ctx_00 = secp_ctx();
  if ((((((priv_key == (uchar *)0x0) || (priv_key_len != 0x20)) || (bytes == (uchar *)0x0)) ||
       ((bytes_len != 0x20 || (s2c_data == (uchar *)0x0)))) ||
      ((s2c_data_len != 0x20 || ((flags != 1 || (bytes_out == (uchar *)0x0)))))) ||
     ((len != 0x40 || ((s2c_opening_out == (uchar *)0x0 || (s2c_opening_out_len != 0x21)))))) {
    priv_key_local._4_4_ = -2;
  }
  else if (ctx_00 == (secp256k1_context *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else {
    iVar1 = secp256k1_ecdsa_s2c_sign
                      (ctx_00,(secp256k1_ecdsa_signature *)(opening_secp.data + 0x38),
                       (secp256k1_ecdsa_s2c_opening *)&ctx,bytes,priv_key,s2c_data);
    if (iVar1 == 0) {
      wally_clear_2(opening_secp.data + 0x38,0x40,&ctx,0x40);
      iVar1 = secp256k1_ec_seckey_verify(ctx_00,priv_key);
      if (iVar1 == 0) {
        priv_key_local._4_4_ = -2;
      }
      else {
        priv_key_local._4_4_ = -1;
      }
    }
    else {
      iVar1 = secp256k1_ecdsa_signature_serialize_compact
                        (ctx_00,bytes_out,(secp256k1_ecdsa_signature *)(opening_secp.data + 0x38));
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_s2c_opening_serialize
                          (ctx_00,s2c_opening_out,(secp256k1_ecdsa_s2c_opening *)&ctx);
        bVar2 = iVar1 != 0;
      }
      wally_clear_2(opening_secp.data + 0x38,0x40,&ctx,0x40);
      priv_key_local._4_4_ = -2;
      if (bVar2) {
        priv_key_local._4_4_ = 0;
      }
    }
  }
  return priv_key_local._4_4_;
}

Assistant:

int wally_s2c_sig_from_bytes(const unsigned char *priv_key, size_t priv_key_len,
                             const unsigned char *bytes, size_t bytes_len,
                             const unsigned char *s2c_data, size_t s2c_data_len,
                             uint32_t flags,
                             unsigned char *s2c_opening_out, size_t s2c_opening_out_len,
                             unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp;
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !s2c_data || s2c_data_len != WALLY_S2C_DATA_LEN ||
        flags != EC_FLAG_ECDSA ||
        !bytes_out || len != EC_SIGNATURE_LEN ||
        !s2c_opening_out || s2c_opening_out_len != WALLY_S2C_OPENING_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!secp256k1_ecdsa_s2c_sign(ctx, &sig_secp, &opening_secp, bytes, priv_key, s2c_data)) {
        wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
        if (!secp256k1_ec_seckey_verify(ctx, priv_key))
            return WALLY_EINVAL; /* invalid priv_key */
        return WALLY_ERROR;     /* Nonce function failed */
    }

    ok = secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out, &sig_secp) &&
         secp256k1_ecdsa_s2c_opening_serialize(ctx, s2c_opening_out, &opening_secp);

    wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}